

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_config.c
# Opt level: O2

ps_type_t ps_config_typeof(ps_config_t *config,char *name)

{
  int32 iVar1;
  ps_type_t pVar2;
  void *in_RAX;
  void *val;
  void *local_8;
  
  local_8 = in_RAX;
  iVar1 = hash_table_lookup(config->ht,name,&local_8);
  pVar2 = 0;
  if ((-1 < iVar1) && (local_8 != (void *)0x0)) {
    pVar2 = *(ps_type_t *)((long)local_8 + 8);
  }
  return pVar2;
}

Assistant:

ps_type_t
ps_config_typeof(ps_config_t *config, char const *name)
{
    void *val;
    if (hash_table_lookup(config->ht, name, &val) < 0)
        return 0;
    if (val == NULL)
        return 0;
    return ((cmd_ln_val_t *)val)->type;
}